

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AcosOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AcosOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AcosOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_54;
  float local_50;
  
  fVar7 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar2 = state->m_shaderParams->maxExpressionDepth;
    iVar3 = state->m_expressionDepth;
    iVar5 = getConservativeValueExprDepth(state,valueRange);
    fVar7 = 0.0;
    if (iVar5 + 1 <= iVar2 - iVar3) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar7 = 1.0;
      }
      else {
        fVar7 = 1.0;
        lVar6 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar11 = valueRange.m_min[lVar6].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar8 = 1.0;
          if (-INFINITY < fVar11) {
            fVar1 = valueRange.m_max[lVar6].floatVal;
            fVar8 = 1.0;
            if (fVar1 < INFINITY) {
              fVar10 = (float)-(uint)(fVar11 <= 3.1415927 && 0.0 <= fVar1);
              fVar9 = fVar10;
              if (((uint)fVar10 & 1) != 0) {
                local_50 = cosf((float)(-(uint)(0.0 <= fVar11) & (uint)fVar11));
                fVar8 = fVar1;
                if (3.1415927 <= fVar1) {
                  fVar8 = 3.1415927;
                }
                fVar9 = cosf(fVar8);
              }
              fVar8 = 0.0;
              if (((uint)fVar10 & 1) != 0) {
                local_54 = ceilf(fVar9 * 8.0);
                local_54 = local_54 * 0.125;
                fVar10 = local_50;
                if (local_54 <= local_50) {
                  fVar8 = floorf(local_50 * 8.0);
                  bVar4 = local_54 <= fVar8 * 0.125;
                  if (bVar4) {
                    bVar4 = true;
                    fVar10 = fVar8 * 0.125;
                  }
                }
                else {
                  bVar4 = false;
                  local_54 = fVar9;
                }
                fVar8 = 0.0;
                if (bVar4) {
                  if ((fVar11 != fVar1) || (fVar8 = 1.0, NAN(fVar11) || NAN(fVar1))) {
                    local_50 = acosf(fVar10);
                    fVar8 = acosf(local_54);
                    fVar11 = (local_50 - fVar8) / (fVar1 - fVar11);
                    fVar8 = 0.1;
                    if (0.1 <= fVar11) {
                      fVar8 = fVar11;
                    }
                  }
                }
              }
            }
          }
          fVar7 = fVar7 * fVar8;
          lVar6 = lVar6 + 1;
        } while (lVar6 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar7;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}